

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckGet
          (ScriptValidator *this,GetAction *action,Type *out_type)

{
  string_view name;
  Module *this_00;
  Export *pEVar1;
  undefined8 uVar2;
  Global *pGVar3;
  Global *global;
  Export *export_;
  Module *module;
  Type *out_type_local;
  GetAction *action_local;
  ScriptValidator *this_local;
  
  this_00 = Script::GetModule(this->script_,(Var *)(action + 0x28));
  if (this_00 == (Module *)0x0) {
    PrintError(this,(Location *)(action + 8),"unknown module");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    name = (string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)(action + 0x70));
    pEVar1 = Module::GetExport(this_00,name);
    if (pEVar1 == (Export *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      PrintError(this,(Location *)(action + 8),"unknown global export \"%s\"",uVar2);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pGVar3 = Module::GetGlobal(this_00,&pEVar1->var);
      if (pGVar3 == (Global *)0x0) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        *out_type = pGVar3->type;
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result ScriptValidator::CheckGet(const GetAction* action, Type* out_type) {
  const Module* module = script_->GetModule(action->module_var);
  if (!module) {
    PrintError(&action->loc, "unknown module");
    return Result::Error;
  }

  const Export* export_ = module->GetExport(action->name);
  if (!export_) {
    PrintError(&action->loc, "unknown global export \"%s\"",
               action->name.c_str());
    return Result::Error;
  }

  const Global* global = module->GetGlobal(export_->var);
  if (!global) {
    // This error will have already been reported, just skip it.
    return Result::Error;
  }

  *out_type = global->type;
  return Result::Ok;
}